

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,char *text,char *defaultValue,int maxSize)

{
  Node *this_00;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *src;
  bool bVar4;
  
  this_00 = this->node;
  uVar1 = Node::getEntry(this_00,key);
  if ((int)uVar1 < 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = this_00->entry_[uVar1].value;
  }
  src = defaultValue;
  if ((pcVar3 == (char *)0x0) || (pcVar2 = strchr(pcVar3,0x5c), src = pcVar3, pcVar2 == (char *)0x0)
     ) {
    if (src == (char *)0x0) {
      *text = '\0';
    }
    else {
      fl_strlcpy(text,src,(long)maxSize);
    }
    bVar4 = src != defaultValue;
  }
  else {
    pcVar3 = decodeText(pcVar3);
    fl_strlcpy(text,pcVar3,(long)maxSize);
    free(pcVar3);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

char Fl_Preferences::get( const char *key, char *text, const char *defaultValue, int maxSize ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    char *w = decodeText( v );
    strlcpy(text, w, maxSize);
    free( w );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v ) strlcpy(text, v, maxSize);
  else *text = 0;
  return ( v != defaultValue );
}